

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O3

Vec_Int_t * Pdr_InvMinimize(Gia_Man_t *p,Vec_Int_t *vInv,int fVerbose)

{
  uint *puVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  Cnf_Dat_t *p_00;
  sat_solver *s;
  sat_solver *p_01;
  lit *begin;
  int *__ptr;
  void *__s;
  Vec_Int_t *p_02;
  int *piVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  int iVar17;
  sat_solver *psVar18;
  ulong uVar19;
  uint *puVar20;
  int iVar21;
  uint uVar22;
  uint uVar23;
  size_t __size;
  ulong uVar24;
  timespec ts;
  uint *local_98;
  long local_60;
  timespec local_50;
  ulong local_40;
  Vec_Int_t *local_38;
  
  iVar3 = clock_gettime(3,&local_50);
  if (iVar3 < 0) {
    local_60 = 1;
  }
  else {
    lVar13 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
    local_60 = ((lVar13 >> 7) - (lVar13 >> 0x3f)) + local_50.tv_sec * -1000000;
  }
  __size = 0;
  p_00 = (Cnf_Dat_t *)Mf_ManGenerateCnf(p,8,0,0,0,0);
  s = (sat_solver *)Cnf_DataWriteIntoSolver(p_00,1,0);
  puVar1 = (uint *)vInv->pArray;
  uVar11 = *puVar1;
  local_38 = vInv;
  p_01 = (sat_solver *)malloc(0x10);
  p_01->size = 100;
  p_01->cap = 0;
  begin = (lit *)malloc(400);
  *(lit **)&p_01->qhead = begin;
  iVar3 = (((int)uVar11 >> 5) + 1) - (uint)((uVar11 & 0x1f) == 0);
  __ptr = (int *)malloc(0x10);
  *__ptr = iVar3 * 0x20;
  if (iVar3 == 0) {
    __s = (void *)0x0;
  }
  else {
    __size = (long)iVar3 << 2;
    __s = malloc(__size);
  }
  *(void **)(__ptr + 2) = __s;
  __ptr[1] = iVar3 * 0x20;
  memset(__s,0,__size);
  iVar3 = p_00->nVars;
  iVar10 = p->nRegs;
  iVar17 = p->vCos->nSize;
  iVar4 = sat_solver_nvars(s);
  iVar5 = sat_solver_nvars(s);
  if (iVar5 != p_00->nVars) {
    __assert_fail("sat_solver_nvars(pSat) == pCnf->nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrInv.c"
                  ,0x333,"Vec_Int_t *Pdr_InvMinimize(Gia_Man_t *, Vec_Int_t *, int)");
  }
  iVar5 = sat_solver_nvars(s);
  psVar18 = s;
  sat_solver_setnvars(s,iVar5 + uVar11);
  iVar5 = (int)psVar18;
  local_98 = puVar1 + 1;
  bVar2 = true;
  if (0 < (int)*puVar1) {
    iVar21 = 0;
    puVar20 = local_98;
    do {
      if (iVar4 < 0) {
LAB_005f2c13:
        __assert_fail("Var >= 0 && !(c >> 1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12e,"int Abc_Var2Lit(int, int)");
      }
      if (p_01->size < 1) {
        if (begin == (int *)0x0) {
          begin = (lit *)malloc(4);
        }
        else {
          begin = (lit *)realloc(begin,4);
        }
        *(lit **)&p_01->qhead = begin;
        if (begin == (int *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        p_01->size = 1;
      }
      *begin = (iVar4 + iVar21) * 2 + 1;
      p_01->cap = 1;
      if ((int)*puVar20 < 1) {
        lVar13 = 1;
      }
      else {
        lVar13 = 0;
        do {
          uVar23 = puVar20[lVar13 + 1];
          if ((int)uVar23 < 0) {
LAB_005f2c32:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          iVar5 = (uVar23 >> 1) + (iVar3 - iVar10);
          if (iVar5 < 0) goto LAB_005f2c13;
          lVar13 = lVar13 + 1;
          Vec_IntPush((Vec_Int_t *)p_01,(uVar23 & 1) + iVar5 * 2 ^ 1);
        } while (lVar13 < (int)*puVar20);
        begin = *(lit **)&p_01->qhead;
        lVar13 = (long)p_01->cap;
      }
      psVar18 = s;
      iVar6 = sat_solver_addclause(s,begin,begin + lVar13);
      iVar5 = (int)psVar18;
      if (iVar6 != 1) {
        __assert_fail("status == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrInv.c"
                      ,0x33e,"Vec_Int_t *Pdr_InvMinimize(Gia_Man_t *, Vec_Int_t *, int)");
      }
      iVar21 = iVar21 + 1;
      puVar20 = puVar20 + (long)(int)*puVar20 + 1;
    } while (iVar21 < (int)*puVar1);
    if (0 < (int)*puVar1) {
      uVar23 = __ptr[1];
      uVar7 = 0;
      if (0 < (int)uVar23) {
        uVar7 = uVar23;
      }
      uVar15 = 0;
      uVar19 = 0;
      do {
        uVar14 = (uint)uVar15;
        if (uVar14 == uVar7) goto LAB_005f2c51;
        uVar24 = uVar15 >> 5;
        if ((*(uint *)((long)__s + uVar24 * 4) >> (uVar14 & 0x1f) & 1) == 0) {
          p_01->cap = 0;
          uVar22 = 0;
          local_40 = uVar24;
          if (0 < (int)uVar11) {
            uVar22 = 0;
            iVar3 = iVar4 * 2;
            do {
              if (uVar14 != uVar22) {
                if ((int)uVar23 <= (int)uVar22) goto LAB_005f2c51;
                if ((*(uint *)((long)__s + (ulong)(uVar22 >> 5) * 4) >> (uVar22 & 0x1f) & 1) == 0) {
                  if ((int)(iVar4 + uVar22) < 0) goto LAB_005f2c13;
                  psVar18 = p_01;
                  Vec_IntPush((Vec_Int_t *)p_01,iVar3);
                }
              }
              uVar22 = uVar22 + 1;
              iVar3 = iVar3 + 2;
            } while (uVar11 != uVar22);
            uVar22 = p_01->cap;
          }
          iVar21 = 2;
          uVar24 = (ulong)uVar22;
          iVar3 = 0;
          do {
            iVar6 = iVar3;
            iVar3 = p->vCos->nSize - p->nRegs;
            if (iVar3 <= iVar6) goto LAB_005f2884;
            if ((int)uVar24 < (int)uVar22) goto LAB_005f2c8f;
            p_01->cap = uVar22;
            Vec_IntPush((Vec_Int_t *)p_01,iVar21);
            uVar24 = (ulong)p_01->cap;
            psVar18 = s;
            iVar8 = sat_solver_solve(s,*(lit **)&p_01->qhead,*(lit **)&p_01->qhead + uVar24,0,0,0,0)
            ;
            iVar5 = (int)psVar18;
            iVar21 = iVar21 + 2;
            iVar3 = iVar6 + 1;
          } while (iVar8 == -1);
          if (iVar8 == 0) {
LAB_005f29ea:
            bVar2 = false;
            goto LAB_005f29ef;
          }
          if (iVar8 != 1) {
            __assert_fail("status == l_False",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrInv.c"
                          ,0x35a,"Vec_Int_t *Pdr_InvMinimize(Gia_Man_t *, Vec_Int_t *, int)");
          }
          iVar3 = p->vCos->nSize - p->nRegs;
LAB_005f2884:
          if (iVar3 <= iVar6) {
            uVar9 = *puVar1;
            if (0 < (int)uVar9) {
              uVar16 = 0;
              puVar20 = local_98;
              do {
                if (uVar16 == uVar7) goto LAB_005f2c51;
                if ((uVar16 != uVar14) &&
                   ((1 << ((byte)uVar16 & 0x1f) & *(uint *)((long)__s + (ulong)(uVar16 >> 5) * 4))
                    == 0)) {
                  if ((int)uVar24 < (int)uVar22) {
LAB_005f2c8f:
                    __assert_fail("p->nSize >= nSizeNew",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                                  ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
                  }
                  p_01->cap = uVar22;
                  uVar9 = uVar22;
                  if (0 < (int)*puVar20) {
                    lVar13 = 0;
                    do {
                      uVar9 = puVar20[lVar13 + 1];
                      if ((int)uVar9 < 0) goto LAB_005f2c32;
                      iVar3 = (uVar9 >> 1) + (iVar17 - iVar10) + 1;
                      if (iVar3 < 0) goto LAB_005f2c13;
                      lVar13 = lVar13 + 1;
                      Vec_IntPush((Vec_Int_t *)p_01,(uVar9 & 1) + iVar3 * 2);
                    } while (lVar13 < (int)*puVar20);
                    uVar9 = p_01->cap;
                  }
                  uVar24 = (ulong)uVar9;
                  psVar18 = s;
                  iVar3 = sat_solver_solve(s,*(lit **)&p_01->qhead,
                                           *(lit **)&p_01->qhead + (int)uVar9,0,0,0,0);
                  iVar5 = (int)psVar18;
                  if (iVar3 != -1) {
                    if (iVar3 == 0) goto LAB_005f29ea;
                    if (iVar3 != 1) {
                      __assert_fail("status == l_True",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrInv.c"
                                    ,0x375,
                                    "Vec_Int_t *Pdr_InvMinimize(Gia_Man_t *, Vec_Int_t *, int)");
                    }
                    goto LAB_005f275f;
                  }
                  uVar9 = *puVar1;
                }
                uVar16 = uVar16 + 1;
                puVar20 = puVar20 + (long)(int)*puVar20 + 1;
              } while ((int)uVar16 < (int)uVar9);
            }
            if (fVerbose != 0) {
              Abc_Print((int)psVar18,"Removing clause %d.\n",uVar15);
            }
            puVar20 = (uint *)((long)__s + local_40 * 4);
            *puVar20 = *puVar20 | 1 << ((byte)uVar15 & 0x1f);
            uVar19 = (ulong)((int)uVar19 + 1);
          }
        }
LAB_005f275f:
        iVar5 = (int)psVar18;
        uVar15 = (ulong)(uVar14 + 1);
      } while ((int)(uVar14 + 1) < (int)*puVar1);
      bVar2 = true;
LAB_005f29ef:
      iVar3 = (int)uVar19;
      if (iVar3 != 0) {
        Abc_Print(iVar5,"Invariant minimization reduced %d clauses (out of %d).  ",uVar19,
                  (ulong)uVar11);
        goto LAB_005f2a1d;
      }
    }
  }
  iVar3 = 0;
  Abc_Print(iVar5,"Invariant minimization did not change the invariant.  ");
LAB_005f2a1d:
  iVar17 = 3;
  iVar10 = clock_gettime(3,&local_50);
  if (iVar10 < 0) {
    lVar13 = -1;
  }
  else {
    lVar13 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
  }
  p_02 = (Vec_Int_t *)0x0;
  Abc_Print(iVar17,"%s =","Time");
  Abc_Print(iVar17,"%9.2f sec\n",(double)(lVar13 + local_60) / 1000000.0);
  if (bVar2 && 0 < iVar3) {
    p_02 = (Vec_Int_t *)malloc(0x10);
    p_02->nCap = 1000;
    p_02->nSize = 0;
    piVar12 = (int *)malloc(4000);
    p_02->pArray = piVar12;
    Vec_IntPush(p_02,uVar11 - iVar3);
    uVar11 = *puVar1;
    if (0 < (int)uVar11) {
      uVar19 = 0;
      uVar15 = (ulong)(uint)__ptr[1];
      if (__ptr[1] < 1) {
        uVar15 = uVar19;
      }
      do {
        uVar23 = (uint)uVar19;
        if (uVar23 == (uint)uVar15) {
LAB_005f2c51:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                        ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
        }
        uVar7 = *local_98;
        if (((*(uint *)((long)__s + (uVar19 >> 5) * 4) >> (uVar23 & 0x1f) & 1) == 0) &&
           (-1 < (int)uVar7)) {
          lVar13 = -1;
          do {
            Vec_IntPush(p_02,local_98[lVar13 + 1]);
            uVar7 = *local_98;
            lVar13 = lVar13 + 1;
          } while (lVar13 < (int)uVar7);
          uVar11 = *puVar1;
        }
        uVar19 = (ulong)(uVar23 + 1);
        local_98 = local_98 + (long)(int)uVar7 + 1;
      } while ((int)(uVar23 + 1) < (int)uVar11);
    }
    if ((long)local_38->nSize < 1) {
      __assert_fail("p->nSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
    }
    Vec_IntPush(p_02,local_38->pArray[(long)local_38->nSize + -1]);
  }
  Cnf_DataFree(p_00);
  sat_solver_delete(s);
  if (__s != (void *)0x0) {
    free(__s);
  }
  free(__ptr);
  if (*(void **)&p_01->qhead != (void *)0x0) {
    free(*(void **)&p_01->qhead);
  }
  free(p_01);
  return p_02;
}

Assistant:

Vec_Int_t * Pdr_InvMinimize( Gia_Man_t * p, Vec_Int_t * vInv, int fVerbose )
{
    int nBTLimit = 0;
    int fCheckProperty = 1;
    abctime clk = Abc_Clock();
    int n, i, k, status, nLits, fFailed = 0, fCannot = 0, nRemoved = 0; 
    Vec_Int_t * vRes = NULL;
    // create SAT solver
    Cnf_Dat_t * pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( p, 8, 0, 0, 0, 0 );
    sat_solver * pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    int * pCube, * pList = Vec_IntArray(vInv), nCubes = pList[0];
    // create variables
    Vec_Int_t * vLits = Vec_IntAlloc(100);
    Vec_Bit_t * vRemoved = Vec_BitStart( nCubes );
    int iFoVarBeg = pCnf->nVars - Gia_ManRegNum(p);
    int iFiVarBeg = 1 + Gia_ManPoNum(p);
    int iAuxVarBeg = sat_solver_nvars(pSat);
    // allocate auxiliary variables
    assert( sat_solver_nvars(pSat) == pCnf->nVars );
    sat_solver_setnvars( pSat, sat_solver_nvars(pSat) + nCubes );
    // add clauses
    Pdr_ForEachCube( pList, pCube, i )
    {
        // collect literals
        Vec_IntFill( vLits, 1, Abc_Var2Lit(iAuxVarBeg + i, 1) ); // neg aux literal
        for ( k = 0; k < pCube[0]; k++ )
            Vec_IntPush( vLits, Abc_Var2Lit(iFoVarBeg + Abc_Lit2Var(pCube[k+1]), !Abc_LitIsCompl(pCube[k+1])) );
        // add it to the solver
        status = sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits) );
        assert( status == 1 );
    }
    // iterate through clauses 
    Pdr_ForEachCube( pList, pCube, i )
    {
        if ( Vec_BitEntry(vRemoved, i) )
            continue;
        // collect aux literals for remaining clauses
        Vec_IntClear( vLits );
        for ( k = 0; k < nCubes; k++ )
            if ( k != i && !Vec_BitEntry(vRemoved, k) ) // skip this cube and already removed cubes
                Vec_IntPush( vLits, Abc_Var2Lit(iAuxVarBeg + k, 0) ); // pos aux literal
        nLits = Vec_IntSize( vLits );
        // check if the property still holds
        if ( fCheckProperty )
        {
            for ( k = 0; k < Gia_ManPoNum(p); k++ )
            {
                Vec_IntShrink( vLits, nLits );
                Vec_IntPush( vLits, Abc_Var2Lit(1+k, 0) );
                status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits), nBTLimit, 0, 0, 0 );
                if ( status == l_Undef ) // timeout
                {
                    fFailed = 1;
                    break;
                }
                if ( status == l_True ) // sat - property fails
                    break;
                assert( status == l_False ); // unsat - property holds
            }
            if ( fFailed )
                break;
            if ( k < Gia_ManPoNum(p) )
                continue;
        }
        // check other clauses
        fCannot = 0;
        Pdr_ForEachCube( pList, pCube, n )
        {
            if ( Vec_BitEntry(vRemoved, n) || n == i )
                continue;
            // collect cube
            Vec_IntShrink( vLits, nLits );
            for ( k = 0; k < pCube[0]; k++ )
               Vec_IntPush( vLits, Abc_Var2Lit(iFiVarBeg + Abc_Lit2Var(pCube[k+1]), Abc_LitIsCompl(pCube[k+1])) );
            // check if this cube intersects with the complement of other cubes in the solver
            // if it does not intersect, then it is redundant and can be skipped
            status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits), nBTLimit, 0, 0, 0 );
            if ( status == l_Undef ) // timeout
            {
                fFailed = 1;
                break;
            }
            if ( status == l_False ) // unsat -- correct
                continue;
            assert( status == l_True );
            // cannot remove
            fCannot = 1;
            break;
        }
        if ( fFailed )
            break;
        if ( fCannot )
            continue;
        if ( fVerbose )
        Abc_Print(1, "Removing clause %d.\n", i );
        Vec_BitWriteEntry( vRemoved, i, 1 );
        nRemoved++;
    }
    if ( nRemoved )
        Abc_Print(1, "Invariant minimization reduced %d clauses (out of %d).  ", nRemoved, nCubes );
    else
        Abc_Print(1, "Invariant minimization did not change the invariant.  " ); 
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    // cleanup cover
    if ( !fFailed && nRemoved > 0 ) // finished without timeout and removed some cubes
    {
        vRes = Vec_IntAlloc( 1000 );
        Vec_IntPush( vRes, nCubes-nRemoved );
        Pdr_ForEachCube( pList, pCube, i )
            if ( !Vec_BitEntry(vRemoved, i) )
                for ( k = 0; k <= pCube[0]; k++ )
                    Vec_IntPush( vRes, pCube[k] );
        Vec_IntPush( vRes, Vec_IntEntryLast(vInv) );
    }
    Cnf_DataFree( pCnf );
    sat_solver_delete( pSat );
    Vec_BitFree( vRemoved );
    Vec_IntFree( vLits );
    return vRes;
}